

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::AddLinkDirectory(cmMakefile *this,string *directory,bool before)

{
  undefined7 in_register_00000011;
  cmListFileBacktrace lfbt;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> local_50;
  cmStateDirectory local_40;
  
  std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,
             (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
             &this->Backtrace);
  if ((int)CONCAT71(in_register_00000011,before) == 0) {
    cmStateSnapshot::GetDirectory(&local_40,&this->StateSnapshot);
    cmStateDirectory::AppendLinkDirectoriesEntry
              (&local_40,directory,(cmListFileBacktrace *)&local_50);
  }
  else {
    cmStateSnapshot::GetDirectory(&local_40,&this->StateSnapshot);
    cmStateDirectory::PrependLinkDirectoriesEntry
              (&local_40,directory,(cmListFileBacktrace *)&local_50);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  return;
}

Assistant:

void cmMakefile::AddLinkDirectory(std::string const& directory, bool before)
{
  cmListFileBacktrace lfbt = this->GetBacktrace();
  if (before) {
    this->StateSnapshot.GetDirectory().PrependLinkDirectoriesEntry(directory,
                                                                   lfbt);
  } else {
    this->StateSnapshot.GetDirectory().AppendLinkDirectoriesEntry(directory,
                                                                  lfbt);
  }
}